

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O2

lattice_site __thiscall
sisl::cartesian_cubic<float>::get_nearest_site(cartesian_cubic<float> *this,vector *pt)

{
  CoeffReturnType pdVar1;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *this_00;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *in_RDX;
  Index extraout_RDX;
  double dVar2;
  lattice_site lVar3;
  int z;
  int y;
  int x;
  CommaInitializer<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> local_38;
  
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](in_RDX,0);
  dVar2 = round(*pdVar1);
  x = (int)dVar2;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](in_RDX,1);
  dVar2 = round(*pdVar1);
  y = (int)dVar2;
  pdVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[](in_RDX,2);
  dVar2 = round(*pdVar1);
  z = (int)dVar2;
  local_38.m_xpr._0_4_ = 3;
  Eigen::Matrix<int,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<int,__1,_1,_0,__1,_1> *)this,(int *)&local_38);
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_38,(Matrix<int,__1,_1,_0,__1,_1> *)this,&x);
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_(&local_38,&y);
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::operator_(this_00,&z);
  Eigen::CommaInitializer<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::finished(&local_38);
  lVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_rows = extraout_RDX;
  lVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage.m_data = (int *)this;
  return (lattice_site)lVar3.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

virtual lattice_site get_nearest_site(const vector &pt) const {
            int x = round(pt[0]);
            int y = round(pt[1]);
            int z = round(pt[2]);

            lattice_site r(3);
            r << x, y, z;

            return r;
        }